

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::resize
          (ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this,size_t size)

{
  ulong local_20;
  size_t i;
  size_t size_local;
  ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *this_local;
  
  if (this->allocatedElements < size) {
    reallocate(this,size);
  }
  for (local_20 = this->usedElements; local_20 < size; local_20 = local_20 + 1) {
    ::wasm::Name::Name(this->data + local_20);
  }
  this->usedElements = size;
  return;
}

Assistant:

void resize(size_t size) {
    if (size > allocatedElements) {
      reallocate(size);
    }
    // construct new elements
    for (size_t i = usedElements; i < size; i++) {
      new (data + i) T();
    }
    usedElements = size;
  }